

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall cmCPackIFWPackage::DefaultConfiguration(cmCPackIFWPackage *this)

{
  cmCPackIFWPackage *this_local;
  
  std::__cxx11::string::operator=((string *)this,"");
  std::__cxx11::string::operator=((string *)&this->Description,"");
  std::__cxx11::string::operator=((string *)&this->Version,"");
  std::__cxx11::string::operator=((string *)&this->ReleaseDate,"");
  std::__cxx11::string::operator=((string *)&this->Script,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Licenses);
  std::__cxx11::string::operator=((string *)&this->SortingPriority,"");
  std::__cxx11::string::operator=((string *)&this->Default,"");
  std::__cxx11::string::operator=((string *)&this->Virtual,"");
  std::__cxx11::string::operator=((string *)&this->ForcedInstallation,"");
  return;
}

Assistant:

void cmCPackIFWPackage::DefaultConfiguration()
{
  DisplayName = "";
  Description = "";
  Version = "";
  ReleaseDate = "";
  Script = "";
  Licenses.clear();
  SortingPriority = "";
  Default = "";
  Virtual = "";
  ForcedInstallation = "";
}